

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

int __thiscall Map_Chest::DelSomeItem(Map_Chest *this,short item_id,int amount)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  pointer pMVar4;
  reference pMVar5;
  double dVar6;
  Map_Chest_Spawn *spawn;
  iterator __end5;
  iterator __begin5;
  list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *__range5;
  double current_time;
  _Self local_28;
  iterator it;
  int amount_local;
  short item_id_local;
  Map_Chest *this_local;
  
  it._M_node._0_4_ = amount;
  it._M_node._6_2_ = item_id;
  local_28._M_node =
       (_List_node_base *)
       std::begin<std::__cxx11::list<Map_Chest_Item,std::allocator<Map_Chest_Item>>>(&this->items);
  while( true ) {
    current_time = (double)std::
                           end<std::__cxx11::list<Map_Chest_Item,std::allocator<Map_Chest_Item>>>
                                     (&this->items);
    bVar2 = std::operator!=(&local_28,(_Self *)&current_time);
    if (!bVar2) {
      return 0;
    }
    pMVar4 = std::_List_iterator<Map_Chest_Item>::operator->(&local_28);
    iVar3 = (int)it._M_node;
    if (pMVar4->id == it._M_node._6_2_) break;
    std::_List_iterator<Map_Chest_Item>::operator++(&local_28);
  }
  pMVar4 = std::_List_iterator<Map_Chest_Item>::operator->(&local_28);
  iVar1 = (int)it._M_node;
  if (iVar3 < pMVar4->amount) {
    pMVar4 = std::_List_iterator<Map_Chest_Item>::operator->(&local_28);
    pMVar4->amount = pMVar4->amount - iVar1;
    pMVar4 = std::_List_iterator<Map_Chest_Item>::operator->(&local_28);
    if (pMVar4->slot != 0) {
      dVar6 = Timer::GetTime();
      __end5 = std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>::begin
                         (&this->spawns);
      spawn = (Map_Chest_Spawn *)
              std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>::end
                        (&this->spawns);
      while (bVar2 = std::operator!=(&__end5,(_Self *)&spawn), bVar2) {
        pMVar5 = std::_List_iterator<Map_Chest_Spawn>::operator*(&__end5);
        iVar3 = pMVar5->slot;
        pMVar4 = std::_List_iterator<Map_Chest_Item>::operator->(&local_28);
        if (iVar3 == pMVar4->slot) {
          pMVar5->last_taken = dVar6;
        }
        std::_List_iterator<Map_Chest_Spawn>::operator++(&__end5);
      }
      pMVar4 = std::_List_iterator<Map_Chest_Item>::operator->(&local_28);
      pMVar4->slot = 0;
    }
    pMVar4 = std::_List_iterator<Map_Chest_Item>::operator->(&local_28);
    return pMVar4->amount;
  }
  iVar3 = DelItem(this,it._M_node._6_2_);
  return iVar3;
}

Assistant:

int Map_Chest::DelSomeItem(short item_id, int amount)
{
	UTIL_IFOREACH(this->items, it)
	{
		if (it->id == item_id)
		{
			if (amount < it->amount)
			{
				it->amount -= amount;

				if (it->slot)
				{
					double current_time = Timer::GetTime();

					UTIL_FOREACH_REF(this->spawns, spawn)
					{
						if (spawn.slot == it->slot)
						{
							spawn.last_taken = current_time;
						}
					}

					it->slot = 0;
				}

				return it->amount;
			}
			else
			{
				return DelItem(item_id);
			}

			break;
		}
	}

	return 0;
}